

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O0

sizes xor16(size_t n)

{
  sizes sVar1;
  _Bool _Var2;
  void *__ptr;
  ulong in_RDI;
  _Bool is_ok;
  size_t i;
  uint64_t *big_set;
  xor16_t filter;
  sizes s;
  xor16_t *in_stack_00000178;
  uint32_t in_stack_00000184;
  uint64_t *in_stack_00000188;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  uint32_t in_stack_ffffffffffffffc0;
  ulong uVar3;
  xor16_t local_30;
  ulong local_18;
  size_t local_10;
  size_t local_8;
  
  local_18 = in_RDI;
  memset(&local_30,0,0x18);
  _Var2 = xor16_allocate(in_stack_ffffffffffffffc0,
                         (xor16_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (_Var2) {
    __ptr = malloc(local_18 << 3);
    for (uVar3 = 0; uVar3 < local_18; uVar3 = uVar3 + 1) {
      *(ulong *)((long)__ptr + uVar3 * 8) = uVar3;
    }
    _Var2 = xor16_populate(in_stack_00000188,in_stack_00000184,in_stack_00000178);
    if (!_Var2) {
      printf("populating failed\n");
    }
    free(__ptr);
    local_10 = xor16_serialization_bytes(&local_30);
    local_8 = xor16_pack_bytes(&local_30);
    xor16_free((xor16_t *)0x1035e2);
  }
  else {
    printf("allocation failed\n");
    local_10 = 0;
    local_8 = 0;
  }
  sVar1.pack = local_8;
  sVar1.standard = local_10;
  return sVar1;
}

Assistant:

sizes xor16(size_t n) {
  xor16_t filter = {0};
  if (! xor16_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = xor16_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = xor16_serialization_bytes(&filter),
    .pack = xor16_pack_bytes(&filter)
  };
  xor16_free(&filter);
  return s;
}